

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

action * action_remove_queue_head(void)

{
  action *act;
  listnode *node;
  action *local_8;
  
  if (action_queue.next == &action_queue) {
    local_8 = (action *)0x0;
  }
  else {
    local_8 = (action *)(action_queue.next + -1);
    list_remove(action_queue.next);
  }
  return local_8;
}

Assistant:

struct action *action_remove_queue_head(void)
{
    if (list_empty(&action_queue)) {
        return 0;
    } else {
        struct listnode *node = list_head(&action_queue);
        struct action *act = node_to_item(node, struct action, qlist);
        list_remove(node);
        return act;
    }
}